

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser_noModelNamespace_Test::~Parser_noModelNamespace_Test(Parser_noModelNamespace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, noModelNamespace)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model/>\n";
    const std::vector<std::string> expectedIssues = {
        "Model element is in an invalid namespace 'null'. A valid CellML root node should be in the namespace 'http://www.cellml.org/cellml/2.0#'.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}